

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O3

bool __thiscall BookChoose::loadBook(BookChoose *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  undefined8 extraout_RAX;
  int row;
  int col;
  int iVar3;
  int row_00;
  int row_01;
  char mov;
  UCT uct;
  char ch;
  int bookSize;
  int I;
  BitBoard op;
  BitBoard my;
  Board tmpBoard;
  ifstream in;
  char local_2cb;
  FullSearch local_2ca;
  char local_2c9;
  mapped_type local_2c8 [2];
  int local_2b8;
  uint local_2b4;
  int local_2b0;
  int local_2ac;
  ulong local_2a8;
  ulong local_2a0;
  Position local_298;
  Board local_290;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,"./book.bin",_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    loadBook();
  }
  std::istream::read((char *)local_238,(long)&local_2b8);
  if (local_2b8 < 1 || (abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    fwrite("Opening Book size error !\n",0x1a,1,_stderr);
    std::ifstream::close();
  }
  else {
    fprintf(_stderr,"bookSize:%d\n");
    FullSearch::FullSearch(&local_2ca);
    if (0 < local_2b8) {
      iVar3 = 0;
      do {
        Board::Board(&local_290);
        std::istream::read((char *)local_238,(long)&local_2a0);
        std::istream::read((char *)local_238,(long)&local_2a8);
        local_290.used = local_2a8 | local_2a0;
        local_290.board = local_2a0;
        local_2b0 = iVar3;
        Board::countBoard(&local_290);
        std::istream::read((char *)local_238,(long)&local_2cb);
        if ('\0' < local_2cb) {
          iVar3 = 0;
          local_2b4 = 0;
          do {
            local_290.used = local_2a8 | local_2a0;
            local_290.board = local_2a0;
            std::istream::read((char *)local_238,(long)&local_2c9);
            std::istream::read((char *)local_238,(long)&local_2ac);
            row = (int)((char)(((byte)(local_2c9 >> 7) >> 5) + local_2c9) >> 3);
            row_00 = 7 - row;
            row_01 = (int)(local_2c9 % '\b');
            col = 7 - row_01;
            Position::Position(&local_298,row_00,col);
            bVar1 = Board::isAbleToChoose(&local_290,local_298);
            if (!bVar1) {
              loadBook();
              FullSearch::~FullSearch(&local_2ca);
              std::ifstream::~ifstream(local_238);
              _Unwind_Resume(extraout_RAX);
            }
            if (local_2ac < -99999) {
              Position::Position(local_2c8,row_00,col);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&BadChoose,&local_290);
              *pmVar2 = local_2c8[0];
              Board::turnLeft(&local_290);
              Position::Position(local_2c8,row_01,row_00);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&BadChoose,&local_290);
              *pmVar2 = local_2c8[0];
              Board::turnLeft(&local_290);
              Position::Position(local_2c8,row,row_01);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&BadChoose,&local_290);
              *pmVar2 = local_2c8[0];
              Board::turnLeft(&local_290);
              Position::Position(local_2c8,col,row);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&BadChoose,&local_290);
              *pmVar2 = local_2c8[0];
            }
            else if (0 < local_2ac && (local_2b4 & 1) == 0) {
              Position::Position(local_2c8,row_00,col);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&GoodChoose,&local_290);
              *pmVar2 = local_2c8[0];
              Board::turnLeft(&local_290);
              Position::Position(local_2c8,row_01,row_00);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&GoodChoose,&local_290);
              *pmVar2 = local_2c8[0];
              Board::turnLeft(&local_290);
              Position::Position(local_2c8,row,row_01);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&GoodChoose,&local_290);
              *pmVar2 = local_2c8[0];
              Board::turnLeft(&local_290);
              Position::Position(local_2c8,col,row);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&GoodChoose,&local_290);
              *pmVar2 = local_2c8[0];
              local_2b4 = (uint)CONCAT71((int7)((ulong)pmVar2 >> 8),1);
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 < local_2cb);
        }
        iVar3 = local_2b0 + 1;
      } while (iVar3 < local_2b8);
    }
    fprintf(_stderr,"Good_size:%lu\n",GoodChoose._M_h._M_element_count);
    fprintf(_stderr,"Bad_size:%lu\n",BadChoose._M_h._M_element_count);
    std::ifstream::close();
    FullSearch::~FullSearch(&local_2ca);
  }
  std::ifstream::~ifstream(local_238);
  return true;
}

Assistant:

bool BookChoose::loadBook() {
    std::ifstream in("./book.bin", std::ios::binary | std::ios::in);
    if (!in) {
        fprintf(stderr, "cannot find Opening Book!\n");
    }

    int bookSize;
    in.read((char *) &bookSize, sizeof(bookSize));
    if (!in || bookSize <= 0) {
        fprintf(stderr, "Opening Book size error !\n");
        in.close();
        return true;
    }

    //book = new Book(bookSize * 3 / 2);
    fprintf(stderr,"bookSize:%d\n",bookSize);
    UCT uct;
    for (int i = 0; i < bookSize; i++) {
        Board tmpBoard;
        //BookNode node;
        BitBoard my,op;
        char ch, mov;
        int I;
        in.read((char *) &my, sizeof(my));
        //node.setMy(bb);
        in.read((char *) &op, sizeof(op));
        //node.setOp(bb);
        tmpBoard.used = my|op;
        tmpBoard.board = my;

        //tmpBoard.printBoard();
        //uct.getNextAction(tmpBoard);
        int black,white ;
        tie(ignore,black,white) = tmpBoard.countBoard();
        in.read(&mov, sizeof(mov));
        //node.setMoveCount(ch);
        //printf("mov:%d\n",mov);
        bool hasGood = false;
        for (int j = 0; j < mov; j++) {
            tmpBoard.used = my|op;
            tmpBoard.board = my;
            in.read(&ch, sizeof(ch));
            in.read((char *) &I, sizeof(I));
            int row= 7-ch/8 , col = 7-ch%8;
//
//            int whiteNum,blackNum;
//            tie(ignore, whiteNum, blackNum) = tmpBoard.countBoard();

            if(!tmpBoard.isAbleToChoose(Position(row,col))){
                fprintf(stderr,"errror!!!");
                exit(1);
            }

            if (I<-99999){
                BadChoose[tmpBoard]=Position(row,col);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(7-col,row);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(7-row,7-col);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(col,7-row);
                continue;
            }
            if (!hasGood && I>0){
                GoodChoose[tmpBoard]=Position(row,col);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(7-col,row);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(7-row,7-col);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(col,7-row);
                hasGood = true;
                continue;
            }




            //node.setMove(j, ch);
            //node.setEval(j, I);
//        }
//        if (!in) {
//            delete book;
//            book = nullptr;
//            in.close();
//            return false;
//        }
//        book->insert(node);
        }

    }
    fprintf(stderr,"Good_size:%lu\n",GoodChoose.size());
    fprintf(stderr, "Bad_size:%lu\n",BadChoose.size());
    in.close();
    return true;
}